

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int jsonParseAddNodeExpand(JsonParse *pParse,u32 eType,u32 n,char *zContent)

{
  uint uVar1;
  u32 uVar2;
  int iVar3;
  JsonNode *pJVar4;
  
  if (pParse->oom == '\0') {
    uVar2 = pParse->nAlloc;
    pJVar4 = pParse->aNode;
    iVar3 = sqlite3_initialize();
    if (iVar3 == 0) {
      uVar1 = uVar2 * 2 + 10;
      pJVar4 = (JsonNode *)sqlite3Realloc(pJVar4,(ulong)uVar1 << 4);
      if (pJVar4 != (JsonNode *)0x0) {
        pParse->nAlloc = uVar1;
        pParse->aNode = pJVar4;
        iVar3 = jsonParseAddNode(pParse,eType,n,zContent);
        return iVar3;
      }
    }
    pParse->oom = '\x01';
  }
  return -1;
}

Assistant:

static JSON_NOINLINE int jsonParseAddNodeExpand(
  JsonParse *pParse,        /* Append the node to this object */
  u32 eType,                /* Node type */
  u32 n,                    /* Content size or sub-node count */
  const char *zContent      /* Content */
){
  u32 nNew;
  JsonNode *pNew;
  assert( pParse->nNode>=pParse->nAlloc );
  if( pParse->oom ) return -1;
  nNew = pParse->nAlloc*2 + 10;
  pNew = sqlite3_realloc64(pParse->aNode, sizeof(JsonNode)*nNew);
  if( pNew==0 ){
    pParse->oom = 1;
    return -1;
  }
  pParse->nAlloc = nNew;
  pParse->aNode = pNew;
  assert( pParse->nNode<pParse->nAlloc );
  return jsonParseAddNode(pParse, eType, n, zContent);
}